

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Imputer::MergeFrom(Imputer *this,Imputer *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  Int64Vector *this_00;
  Int64Vector *from_00;
  DoubleVector *this_01;
  DoubleVector *from_01;
  StringToDoubleMap *this_02;
  StringToDoubleMap *from_02;
  Int64ToDoubleMap *this_03;
  Int64ToDoubleMap *from_03;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/Imputer.pb.cc"
               ,0x266);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    set_imputeddoublevalue(this,(from->ImputedValue_).imputeddoublevalue_);
    break;
  case 2:
    set_imputedint64value(this,(from->ImputedValue_).imputedint64value_);
    break;
  case 3:
    set_imputedstringvalue(this,(string *)(from->ImputedValue_).imputeddoublearray_);
    break;
  case 4:
    this_01 = mutable_imputeddoublearray(this);
    from_01 = imputeddoublearray(from);
    DoubleVector::MergeFrom(this_01,from_01);
    break;
  case 5:
    this_00 = mutable_imputedint64array(this);
    from_00 = imputedint64array(from);
    Int64Vector::MergeFrom(this_00,from_00);
    break;
  case 6:
    this_02 = mutable_imputedstringdictionary(this);
    from_02 = imputedstringdictionary(from);
    StringToDoubleMap::MergeFrom(this_02,from_02);
    break;
  case 7:
    this_03 = mutable_imputedint64dictionary(this);
    from_03 = imputedint64dictionary(from);
    Int64ToDoubleMap::MergeFrom(this_03,from_03);
  }
  uVar1 = from->_oneof_case_[1];
  if (uVar1 == 0xd) {
    set_replacestringvalue(this,(string *)from->ReplaceValue_);
  }
  else if (uVar1 == 0xc) {
    set_replaceint64value(this,(from->ReplaceValue_).replaceint64value_);
  }
  else if (uVar1 == 0xb) {
    set_replacedoublevalue(this,(from->ReplaceValue_).replacedoublevalue_);
  }
  return;
}

Assistant:

void Imputer::MergeFrom(const Imputer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Imputer)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.ImputedValue_case()) {
    case kImputedDoubleValue: {
      set_imputeddoublevalue(from.imputeddoublevalue());
      break;
    }
    case kImputedInt64Value: {
      set_imputedint64value(from.imputedint64value());
      break;
    }
    case kImputedStringValue: {
      set_imputedstringvalue(from.imputedstringvalue());
      break;
    }
    case kImputedDoubleArray: {
      mutable_imputeddoublearray()->::CoreML::Specification::DoubleVector::MergeFrom(from.imputeddoublearray());
      break;
    }
    case kImputedInt64Array: {
      mutable_imputedint64array()->::CoreML::Specification::Int64Vector::MergeFrom(from.imputedint64array());
      break;
    }
    case kImputedStringDictionary: {
      mutable_imputedstringdictionary()->::CoreML::Specification::StringToDoubleMap::MergeFrom(from.imputedstringdictionary());
      break;
    }
    case kImputedInt64Dictionary: {
      mutable_imputedint64dictionary()->::CoreML::Specification::Int64ToDoubleMap::MergeFrom(from.imputedint64dictionary());
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  switch (from.ReplaceValue_case()) {
    case kReplaceDoubleValue: {
      set_replacedoublevalue(from.replacedoublevalue());
      break;
    }
    case kReplaceInt64Value: {
      set_replaceint64value(from.replaceint64value());
      break;
    }
    case kReplaceStringValue: {
      set_replacestringvalue(from.replacestringvalue());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
}